

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

void __thiscall Exttpose::tpose(Exttpose *this)

{
  value_type vVar1;
  unsigned_long uVar2;
  size_type sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  void *pvVar8;
  reference pvVar9;
  runtime_error *prVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  double dVar14;
  int local_910;
  int seqs;
  int l2cnt;
  int lit;
  int start;
  int offt;
  string local_8e0 [8];
  string tmpiset;
  string local_8c0 [8];
  string tmpseq;
  string local_8a0 [8];
  fstream seqfd;
  string local_690 [8];
  fstream isetfd;
  char local_680 [512];
  int local_480;
  undefined4 local_47c;
  int ocid;
  int null;
  int file_offset;
  string local_450 [8];
  string tmpnam;
  int local_42c;
  int *local_428;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_420;
  int local_414;
  int *local_410;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_408;
  int local_3fc;
  int *local_3f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3f0;
  int local_3e4;
  int local_3e0;
  int pblk;
  int pub;
  int plb;
  ostringstream tmpnamestrm;
  long local_260;
  long extarysz;
  int local_250;
  int maxcustid;
  int mincustid;
  int *local_240;
  int *buf;
  int sumdiff;
  int sumsup;
  ofstream ofd;
  int local_30;
  int local_2c;
  int fcnt;
  int numitem;
  int tid;
  int custid;
  int idx;
  int l;
  int j;
  int i;
  Exttpose *this_local;
  
  _j = this;
  std::ofstream::ofstream(&sumdiff);
  buf._4_4_ = 0;
  buf._0_4_ = 0;
  DbaseCtrlBlk::get_first_blk(&this->dcb);
  DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
  local_250 = numitem;
  while (iVar5 = DbaseCtrlBlk::eof(&this->dcb), iVar5 == 0) {
    for (idx = 0; idx < local_2c; idx = idx + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)local_240[idx])
      ;
      *pvVar9 = *pvVar9 + 1;
      if ((this->args->use_seq != 0) &&
         (pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->ocnt,(long)local_240[idx]), *pvVar9 != numitem)) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->itcnt,(long)local_240[idx]);
        iVar5 = numitem;
        *pvVar9 = *pvVar9 + 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->ocnt,(long)local_240[idx]);
        *pvVar9 = iVar5;
      }
    }
    DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
  }
  extarysz._4_4_ = numitem;
  poVar7 = std::operator<<((ostream *)&this->env->logger,"MINMAX ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_250);
  poVar7 = std::operator<<(poVar7," ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,extarysz._4_4_);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  for (l = 0; l < this->args->DBASE_MAXITEM; l = l + 1) {
    if (this->args->use_seq == 0) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
      if ((long)*pvVar9 < this->args->MINSUPPORT) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
        *pvVar9 = -1;
      }
      else {
        uVar2 = this->numfreq;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
        *pvVar9 = (value_type)uVar2;
        this->numfreq = this->numfreq + 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
        buf._4_4_ = *pvVar9 + buf._4_4_;
        iVar5 = this->args->DBASE_NUM_TRANS;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
        buf._0_4_ = (iVar5 - *pvVar9) + (int)buf;
      }
    }
    else {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itcnt,(long)l);
      if ((long)*pvVar9 < this->args->MINSUPPORT) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
        *pvVar9 = -1;
      }
      else {
        poVar7 = (ostream *)std::ostream::operator<<(&this->env->logger,l);
        poVar7 = std::operator<<(poVar7," SUPP ");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itcnt,(long)l);
        pvVar8 = (void *)std::ostream::operator<<(poVar7,*pvVar9);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        uVar2 = this->numfreq;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
        *pvVar9 = (value_type)uVar2;
        this->numfreq = this->numfreq + 1;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->backidx,this->numfreq);
  this->numfreq = 0;
  for (l = 0; l < this->args->DBASE_MAXITEM; l = l + 1) {
    if (this->args->use_seq == 0) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
      iVar5 = l;
      if (this->args->MINSUPPORT <= (long)*pvVar9) {
        sVar3 = this->numfreq;
        this->numfreq = sVar3 + 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->backidx,sVar3);
        *pvVar9 = iVar5;
      }
    }
    else {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itcnt,(long)l);
      iVar5 = l;
      if (this->args->MINSUPPORT <= (long)*pvVar9) {
        sVar3 = this->numfreq;
        this->numfreq = sVar3 + 1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->backidx,sVar3);
        *pvVar9 = iVar5;
      }
    }
  }
  poVar7 = std::operator<<((ostream *)&this->env->logger,"numfreq ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->numfreq);
  poVar7 = std::operator<<(poVar7," :  ");
  poVar7 = std::operator<<(poVar7," SUMSUP SUMDIFF = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,buf._4_4_);
  poVar7 = std::operator<<(poVar7," ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,(int)buf);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&this->env->summary," F1stats = [ ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->numfreq);
  poVar7 = std::operator<<(poVar7," ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,buf._4_4_);
  poVar7 = std::operator<<(poVar7," ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)buf);
  std::operator<<(poVar7," ]");
  if (this->numfreq == 0) {
    extarysz._0_4_ = 1;
  }
  else {
    local_260 = (long)((ulong)this->args->AMEM / this->numfreq) / 4;
    poVar7 = std::operator<<((ostream *)&this->env->logger,"EXTRARYSZ ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,local_260);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    if (local_260 < 2) {
      local_260 = 2;
    }
    std::vector<TransArray,_std::allocator<TransArray>_>::reserve(&this->extary,this->numfreq);
    for (l = 0; (ulong)(long)l < this->numfreq; l = l + 1) {
      std::vector<TransArray,std::allocator<TransArray>>::emplace_back<long&,int&>
                ((vector<TransArray,std::allocator<TransArray>> *)&this->extary,&local_260,
                 &this->args->num_partitions);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pub);
    dVar14 = ceil((double)((extarysz._4_4_ - local_250) + 1) / (double)this->args->num_partitions);
    local_3e4 = (int)dVar14;
    if (this->args->do_invert != 0) {
      if (1 < this->args->num_partitions) {
        DbaseCtrlBlk::get_first_blk(&this->dcb);
        DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
      }
      for (idx = 0; idx < this->args->num_partitions; idx = idx + 1) {
        std::operator<<((ostream *)&pub,(string *)&this->args->idxfn);
        if (1 < this->args->num_partitions) {
          poVar7 = std::operator<<((ostream *)&pub,".P");
          std::ostream::operator<<(poVar7,idx);
          pblk = idx * local_3e4 + local_250;
          local_3e0 = pblk + local_3e4;
          if (extarysz._4_4_ < local_3e0) {
            local_3e0 = extarysz._4_4_ + 1;
          }
          local_3f0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->itcnt);
          local_3f8 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->itcnt);
          local_3fc = 0;
          std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    (local_3f0,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_3f8,
                     &local_3fc);
          local_408._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->ocnt);
          local_410 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->ocnt);
          local_414 = -1;
          std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    (local_408,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_410,
                     &local_414);
          local_420._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->itlen);
          local_428 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->itlen);
          local_42c = 0;
          std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    (local_420,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_428,
                     &local_42c);
          while (iVar5 = DbaseCtrlBlk::eof(&this->dcb), iVar5 == 0 && numitem < local_3e0) {
            for (l = 0; l < local_2c; l = l + 1) {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->itlen,(long)local_240[l]);
              *pvVar9 = *pvVar9 + 1;
              if ((this->args->use_seq != 0) &&
                 (pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->ocnt,(long)local_240[l]), *pvVar9 != numitem)) {
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->itcnt,(long)local_240[l]);
                iVar5 = numitem;
                *pvVar9 = *pvVar9 + 1;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->ocnt,(long)local_240[l]);
                *pvVar9 = iVar5;
              }
            }
            DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
          }
        }
        std::__cxx11::ostringstream::str();
        poVar7 = std::operator<<((ostream *)&this->env->logger,"OPENED ");
        poVar7 = std::operator<<(poVar7,local_450);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::ofstream::open((string *)&sumdiff,(_Ios_Openmode)local_450);
        bVar4 = std::ios::operator!((ios *)((long)&sumdiff + *(long *)(_sumdiff + -0x18)));
        if ((bVar4 & 1) != 0) {
          null._3_1_ = 1;
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)&file_offset,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Can\'t open file ");
          std::runtime_error::runtime_error(prVar10,(string *)&file_offset);
          null._3_1_ = 0;
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ocid = 0;
        local_47c = 0xffffffff;
        for (l = 0; l < this->args->DBASE_MAXITEM; l = l + 1) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
          if (*pvVar9 == -1) {
            if (this->args->no_minus_off == '\0') {
              std::ostream::write((char *)&sumdiff,(long)&local_47c);
            }
            else {
              std::ostream::write((char *)&sumdiff,(long)&ocid);
            }
          }
          else {
            std::ostream::write((char *)&sumdiff,(long)&ocid);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->freqidx,(long)l);
            pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                (&this->extary,(long)*pvVar9);
            TransArray::set_offset(pvVar11,(long)ocid,idx);
            if (this->args->use_seq == 0) {
              if (this->args->use_diff == '\0') {
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
                ocid = *pvVar9 + ocid;
              }
              else {
                iVar5 = this->args->DBASE_NUM_TRANS;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
                ocid = (iVar5 - *pvVar9) + ocid;
              }
            }
            else if (this->args->use_newformat == '\0') {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itcnt,(long)l);
              iVar5 = *pvVar9;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
              ocid = iVar5 * 2 + *pvVar9 + ocid;
            }
            else {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->itlen,(long)l);
              ocid = *pvVar9 * 2 + ocid;
            }
          }
        }
        poVar7 = std::operator<<((ostream *)&this->env->logger,"OFF ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,l);
        poVar7 = std::operator<<(poVar7," ");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,ocid);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::ostream::write((char *)&sumdiff,(long)&ocid);
        std::ofstream::close();
        std::__cxx11::string::~string(local_450);
      }
    }
    poVar7 = std::operator<<((ostream *)&this->env->logger,"Wrote Offt ");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::resize(&this->fidx,this->numfreq);
    local_480 = -1;
    if (this->args->do_l2 != 0) {
      std::fstream::fstream(local_690);
      std::fstream::fstream(local_8a0);
      std::__cxx11::string::string(local_8c0);
      std::__cxx11::string::string(local_8e0);
      if (this->args->use_seq != 0) {
        std::__cxx11::string::operator=(local_8c0,(string *)&this->args->tmpfn);
        std::operator|(_S_bin,_S_trunc);
        std::fstream::open(local_8a0,(_Ios_Openmode)local_8c0);
        bVar4 = std::fstream::is_open();
        if ((bVar4 & 1) == 0) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Can\'t open out file");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                     (char *)&this->args->tmpfn);
      std::__cxx11::string::operator=(local_8e0,(string *)&start);
      std::__cxx11::string::~string((string *)&start);
      std::operator|(_S_bin,_S_trunc);
      std::fstream::open(local_690,(_Ios_Openmode)local_8e0);
      bVar4 = std::fstream::is_open();
      if ((bVar4 & 1) == 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Can\'t open out file");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->args->use_seq != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&this->seq2,this->numfreq * this->numfreq);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->itcnt2,this->numfreq * (this->numfreq - 1) >> 1);
      std::vector<char,_std::allocator<char>_>::resize
                (&this->ocust,this->numfreq * (this->numfreq - 1) >> 1);
      std::vector<int,_std::allocator<int>_>::resize(&this->offsets,this->numfreq);
      lit = 0;
      l2cnt = (int)this->numfreq;
      l = l2cnt;
      while (iVar5 = lit, l = l + -1, -1 < l) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->offsets,(this->numfreq - (long)l) - 1);
        *pvVar9 = iVar5;
        lit = l + lit;
      }
      local_480 = -1;
      DbaseCtrlBlk::get_first_blk(&this->dcb);
      DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
      while (iVar5 = DbaseCtrlBlk::eof(&this->dcb), iVar5 == 0) {
        local_30 = 0;
        local_480 = numitem;
        while (iVar5 = DbaseCtrlBlk::eof(&this->dcb), iVar5 == 0 && local_480 == numitem) {
          for (idx = 0; idx < local_2c; idx = idx + 1) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->freqidx,(long)local_240[idx]);
            tid = *pvVar9;
            if (tid != -1) {
              if (this->args->use_seq == 0) {
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->offsets,(long)tid);
                seqs = (*pvVar9 - tid) + -1;
                custid = idx;
                while (custid = custid + 1, custid < local_2c) {
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->freqidx,(long)local_240[custid]);
                  iVar5 = seqs;
                  if (*pvVar9 != -1) {
                    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&this->freqidx,(long)local_240[custid]);
                    pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        (&this->itcnt2,(long)(iVar5 + *pvVar9));
                    vVar1 = *pvVar13;
                    *pvVar13 = vVar1 + '\x01';
                    if ((value_type)(vVar1 + '\x01') == '\0') {
                      std::ostream::write(local_680,(long)(local_240 + idx));
                      std::ostream::write(local_680,(long)(local_240 + custid));
                    }
                  }
                }
              }
              else {
                pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                    (&this->extary,(long)tid);
                iVar6 = TransArray::size(pvVar11);
                iVar5 = tid;
                if (iVar6 == 0) {
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->fidx,(long)local_30);
                  *pvVar9 = iVar5;
                  local_30 = local_30 + 1;
                  pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                      (&this->extary,(long)tid);
                  TransArray::setitem(pvVar11,0,fcnt);
                  pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                      (&this->extary,(long)tid);
                  TransArray::setitem(pvVar11,1,fcnt);
                  pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                      (&this->extary,(long)tid);
                  TransArray::setsize(pvVar11,2);
                }
                else {
                  pvVar11 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                      (&this->extary,(long)tid);
                  TransArray::setitem(pvVar11,1,fcnt);
                }
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->offsets,(long)tid);
                seqs = (*pvVar9 - tid) + -1;
                custid = idx;
                while (custid = custid + 1, custid < local_2c) {
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->freqidx,(long)local_240[custid]);
                  iVar5 = seqs;
                  if (*pvVar9 != -1) {
                    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&this->freqidx,(long)local_240[custid]);
                    pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                                        (&this->ocust,(long)(iVar5 + *pvVar9));
                    *pvVar12 = '\x01';
                  }
                }
              }
            }
          }
          DbaseCtrlBlk::get_next_trans(&this->dcb,&local_240,&local_2c,&fcnt,&numitem);
        }
        if (this->args->use_seq != 0) {
          process_cust(this,local_30,(fstream *)local_8a0,(fstream *)local_690);
        }
      }
      std::vector<char,_std::allocator<char>_>::clear(&this->ocust);
      poVar7 = std::operator<<((ostream *)&this->env->logger,"2-IT ");
      poVar7 = std::operator<<(poVar7," ");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_910 = 0;
      if (this->args->use_seq != 0) {
        std::ofstream::open((string *)&sumdiff,(int)this->args + 0xa0);
        bVar4 = std::ios::fail();
        if ((bVar4 & 1) != 0) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Can\'t open seq file");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sort_get_l2(this,&local_910,(fstream *)local_8a0,(ofstream *)&sumdiff,&this->seq2,true);
        std::ofstream::close();
        poVar7 = std::operator<<((ostream *)&this->env->logger,"SEQ2 cnt ");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,local_910);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&this->env->summary," ");
        std::ostream::operator<<(poVar7,local_910);
      }
      iVar5 = local_910;
      std::ofstream::open((string *)&sumdiff,(int)this->args + 0x80);
      bVar4 = std::ios::fail();
      if ((bVar4 & 1) != 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Can\'t open it2 file");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sort_get_l2(this,&local_910,(fstream *)local_690,(ofstream *)&sumdiff,&this->itcnt2,false);
      std::ofstream::close();
      poVar7 = std::operator<<((ostream *)&this->env->logger,"SORT ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_910);
      poVar7 = std::operator<<(poVar7,"  ");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&this->env->summary," F2stats = [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_910);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      std::operator<<(poVar7," ]");
      std::vector<int,_std::allocator<int>_>::clear(&this->offsets);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->itcnt2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->seq2);
      std::__cxx11::string::~string(local_8e0);
      std::__cxx11::string::~string(local_8c0);
      std::fstream::~fstream(local_8a0);
      std::fstream::~fstream(local_690);
    }
    if (this->args->do_invert != 0) {
      do_invert_db(this,local_3e4,local_250,extarysz._4_4_);
    }
    std::vector<int,_std::allocator<int>_>::clear(&this->freqidx);
    std::vector<int,_std::allocator<int>_>::clear(&this->backidx);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pub);
    extarysz._0_4_ = 0;
  }
  std::ofstream::~ofstream(&sumdiff);
  return;
}

Assistant:

void Exttpose::tpose() {
    int i, j, l;
    int idx;
    int custid, tid, numitem, fcnt;
    ofstream ofd;
    int sumsup = 0, sumdiff = 0;

    //count 1 items
    int *buf;
    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int mincustid = custid;
    while (!dcb.eof()) {
        //env.logger << custid << " " << tid << " " << numitem;
        for (j = 0; j < numitem; j++) {
            //env.logger << " " << buf[j] << flush;
            itlen[buf[j]]++;
            if (args.use_seq && ocnt[buf[j]] != custid) {
                itcnt[buf[j]]++;
                ocnt[buf[j]] = custid;
            }
            //if (buf[j] == 17) env.logger << " " << tid;
        }
        //env.logger << endl;
        dcb.get_next_trans(buf, numitem, tid, custid);
    }
    //env.logger << endl;
    int maxcustid = static_cast<int>(custid);
    env.logger << "MINMAX " << mincustid << " " << maxcustid << endl;

    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT) {
                env.logger << i << " SUPP " << itcnt[i] << endl;
                freqidx[i] = numfreq;
                numfreq++;
            } else freqidx[i] = static_cast<int>(-1);
        } else {
            if (itlen[i] >= args.MINSUPPORT) {
                freqidx[i] = numfreq;
                numfreq++;
                sumsup += itlen[i];
                sumdiff += (args.DBASE_NUM_TRANS - itlen[i]);
            } else freqidx[i] = static_cast<int>(-1);
        }
        //if (i == 17) env.logger << " 17 SUP " << itlen[17] << endl;
    }

    backidx.resize(numfreq);

    numfreq = 0;
    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        } else {
            if (itlen[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        }
    }

    env.logger << "numfreq " << numfreq << " :  " << " SUMSUP SUMDIFF = " << sumsup << " " << sumdiff << endl;

    env.summary << " F1stats = [ " << numfreq << " " << sumsup << " " << sumdiff << " ]";

    if (numfreq == 0) return;

    long extarysz = args.AMEM / numfreq;
    extarysz /= INT_SIZE;
    env.logger << "EXTRARYSZ " << extarysz << endl;
    if (extarysz < 2) extarysz = 2;

    extary.reserve(numfreq);

    for (i = 0; i < numfreq; i++) {
        extary.emplace_back(extarysz, args.num_partitions);
    }

    ostringstream tmpnamestrm;
    int plb, pub, pblk;
    pblk = static_cast<int>(ceil(((double) (maxcustid - mincustid + 1)) / args.num_partitions));
    if (args.do_invert) {
        if (args.num_partitions > 1) {
            dcb.get_first_blk();
            dcb.get_next_trans(buf, numitem, tid, custid);
        }
        for (j = 0; j < args.num_partitions; j++) {
            //construct offsets for 1-itemsets
            tmpnamestrm << args.idxfn;
            if (args.num_partitions > 1) {
                tmpnamestrm << ".P" << j;
                plb = j * pblk + mincustid;
                pub = plb + pblk;
                if (pub > maxcustid) pub = maxcustid + 1;
                std::fill(itcnt.begin(), itcnt.end(), 0);
                std::fill(ocnt.begin(), ocnt.end(), -1);
                std::fill(itlen.begin(), itlen.end(), 0);

                for (; !dcb.eof() && custid < pub;) {
                    for (i = 0; i < numitem; i++) {
                        itlen[buf[i]]++;
                        if (args.use_seq && ocnt[buf[i]] != custid) {
                            itcnt[buf[i]]++;
                            ocnt[buf[i]] = custid;
                        }
                    }
                    dcb.get_next_trans(buf, numitem, tid, custid);
                }
            }
            string tmpnam = tmpnamestrm.str();
            env.logger << "OPENED " << tmpnam << endl;
            ofd.open(tmpnam, ios::binary);
            if (!ofd) {
                throw runtime_error("Can't open file " + tmpnam);
            }

            int file_offset = 0;
            int null = -1;
            for (i = 0; i < args.DBASE_MAXITEM; i++) {
                //if (i == 17) env.logger << "LIDX " << i << " " << itlen[i] << endl;
                if (freqidx[i] != -1) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                    extary[freqidx[i]].set_offset(file_offset, j);
                    if (args.use_seq) {
                        if (args.use_newformat) file_offset += (2 * itlen[i]);
                        else file_offset += (2 * itcnt[i] + itlen[i]);
                    } else {
                        if (args.use_diff) file_offset += (args.DBASE_NUM_TRANS - itlen[i]);
                        else file_offset += itlen[i];
                    }
                } else if (args.no_minus_off) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                } else ofd.write((char *) &null, INT_SIZE);
                //env.logger << "OFF " << i <<" " << file_offset << endl;
            }
            env.logger << "OFF " << i << " " << file_offset << endl;
            ofd.write((char *) &file_offset, INT_SIZE);
            ofd.close();
        }
    }

    env.logger << "Wrote Offt " << endl;

    fidx.resize(numfreq);

    int ocid = -1;
    if (args.do_l2) {
        fstream isetfd;
        fstream seqfd;
        string tmpseq, tmpiset;

        if (args.use_seq) {
            tmpseq = args.tmpfn;
            seqfd.open(tmpseq, ios::binary | ios::trunc);
            if (!seqfd.is_open()) {
                throw runtime_error("Can't open out file");
            }
        }
        tmpiset = args.tmpfn + "iset";
        isetfd.open(tmpiset, ios::binary | ios::trunc);

        if (!isetfd.is_open()) {
            throw runtime_error("Can't open out file");
        }

        if (args.use_seq) {
            seq2.reserve(numfreq * numfreq);
        }

        itcnt2.resize(numfreq * (numfreq - 1) / 2);
        ocust.resize(numfreq * (numfreq - 1) / 2);
        offsets.resize(numfreq);

        int offt = 0;
        int start = static_cast<int>(numfreq);
        for (i = start - 1; i >= 0; i--) {
            offsets[numfreq - i - 1] = offt;
            offt += i;
        }

        ocid = -1;
        int lit;
        //count 2-itemsets
        dcb.get_first_blk();
        dcb.get_next_trans(buf, numitem, tid, custid);
        while (!dcb.eof()) {
            fcnt = 0;
            ocid = custid;
            while (!dcb.eof() && ocid == custid) {
                for (j = 0; j < numitem; j++) {
                    idx = freqidx[buf[j]];
                    if (idx != -1) {
                        if (args.use_seq) {
                            if (extary[idx].size() == 0) {
                                fidx[fcnt] = idx;
                                fcnt++;
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                extary[idx].setitem(0, tid);
                                extary[idx].setitem(1, tid);
                                extary[idx].setsize(2);
                            } else {
                                extary[idx].setitem(1, tid);
                            }

                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    ocust[lit + freqidx[buf[l]]] = 1;
                                }
                            }
                        } else {
                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    if ((++itcnt2[lit + freqidx[buf[l]]]) == 0) {
                                        isetfd.write((char *) &buf[j], INT_SIZE);
                                        isetfd.write((char *) &buf[l], INT_SIZE);
                                    }
                                }
                            }
                        }
                    }
                }
                dcb.get_next_trans(buf, numitem, tid, custid);
            }

            if (args.use_seq) {
                process_cust(fcnt, seqfd, isetfd);
            }
        }
        ocust.clear();
        env.logger << "2-IT " << " " << endl;

        //write 2-itemsets counts to file
        int l2cnt = 0;
        if (args.use_seq) {
            ofd.open(args.seqfn, ios::binary);
            if (ofd.fail()) {
                throw runtime_error("Can't open seq file");
            }
            sort_get_l2(l2cnt, seqfd, ofd, seq2, true);

            ofd.close();
            env.logger << "SEQ2 cnt " << l2cnt << endl;
            env.summary << " " << l2cnt;
        }
        int seqs = l2cnt;

        ofd.open(args.it2fn, ios::binary);
        //if ((fd = open(args.it2fn, (O_WRONLY|O_CREAT|O_TRUNC|O_BINARY), 0666)) < 0){
        if (ofd.fail()) {
            throw runtime_error("Can't open it2 file");
        }
        sort_get_l2(l2cnt, isetfd, ofd, itcnt2, false);
        ofd.close();
        env.logger << "SORT " << l2cnt << "  " << endl;

        env.summary << " F2stats = [" << l2cnt << " " << seqs << " ]";
        offsets.clear();
        itcnt2.clear();
        seq2.clear();
    }

    if (args.do_invert) {
        do_invert_db(pblk, mincustid, maxcustid);
    }

    freqidx.clear();
    backidx.clear();
}